

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * QString::sliced_helper
                    (QString *__return_storage_ptr__,QString *str,qsizetype pos,qsizetype n)

{
  char16_t *pcVar1;
  Data *pDVar2;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (n == 0) {
    pcVar1 = &_empty;
    pDVar2 = (Data *)0x0;
    puVar3 = (undefined1 *)0x0;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::sliced(&local_38,&str->d,pos,n);
    local_38.ptr[n] = L'\0';
    pcVar1 = local_38.ptr;
    pDVar2 = local_38.d;
    puVar3 = (undefined1 *)local_38.size;
  }
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = pcVar1;
  (__return_storage_ptr__->d).size = (qsizetype)puVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::sliced_helper(QString &str, qsizetype pos, qsizetype n)
{
    if (n == 0)
        return QString(DataPointer::fromRawData(&_empty, 0));
    DataPointer d = std::move(str.d).sliced(pos, n);
    d.data()[n] = 0;
    return QString(std::move(d));
}